

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_store_fpr_Q(DisasContext_conflict8 *dc,uint dst,TCGv_i32 v1,TCGv_i32 v2)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i32 pTVar2;
  uint uVar3;
  uintptr_t o_3;
  
  pTVar1 = dc->uc->tcg_ctx;
  uVar3 = dst & 0x1c | (dst & 1) << 5;
  pTVar2 = *(TCGv_i32 *)((long)pTVar1->cpu_fpr + (ulong)uVar3 * 4);
  if (pTVar2 != v1) {
    tcg_gen_op2_sparc64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)pTVar1),
                        (TCGArg)(v1 + (long)pTVar1));
  }
  if (pTVar1->cpu_fpr[(ulong)(uVar3 >> 1) + 1] != (TCGv_i64)v2) {
    tcg_gen_op2_sparc64(pTVar1,INDEX_op_mov_i64,
                        (TCGArg)(pTVar1->cpu_fpr[(ulong)(uVar3 >> 1) + 1] + (long)pTVar1),
                        (TCGArg)(v2 + (long)pTVar1));
  }
  uVar3 = 2 - ((dst & 1) == 0);
  if ((dc->fprs_dirty & uVar3) != 0) {
    return;
  }
  pTVar1 = dc->uc->tcg_ctx;
  dc->fprs_dirty = dc->fprs_dirty | uVar3;
  pTVar2 = pTVar1->cpu_fprs;
  tcg_gen_ori_i32_sparc64(pTVar1,pTVar2,pTVar2,uVar3);
  return;
}

Assistant:

static void gen_store_fpr_Q(DisasContext *dc, unsigned int dst,
                            TCGv_i64 v1, TCGv_i64 v2)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    dst = QFPREG(dst);

    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], v1);
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2 + 1], v2);
    gen_update_fprs_dirty(dc, dst);
}